

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

void __thiscall
Memory::Recycler::VerifyMarkArenaMemoryBlockList(Recycler *this,ArenaMemoryBlock *memoryBlocks)

{
  void *pvVar1;
  char *pcVar2;
  ulong local_40;
  size_t i;
  size_t slotCount;
  void **base;
  ArenaMemoryBlock *blockp;
  size_t scanRootBytes;
  ArenaMemoryBlock *memoryBlocks_local;
  Recycler *this_local;
  
  for (base = (void **)memoryBlocks; base != (void **)0x0; base = (void **)*base) {
    pcVar2 = ArenaMemoryBlock::GetBytes((ArenaMemoryBlock *)base);
    pvVar1 = base[1];
    for (local_40 = 0; local_40 < (ulong)pvVar1 >> 3; local_40 = local_40 + 1) {
      VerifyMark(this,*(void **)(pcVar2 + local_40 * 8));
    }
  }
  return;
}

Assistant:

void
Recycler::VerifyMarkArenaMemoryBlockList(ArenaMemoryBlock * memoryBlocks)
{
    size_t scanRootBytes = 0;
    ArenaMemoryBlock *blockp = memoryBlocks;
    while (blockp != NULL)
    {
        void** base=(void**)blockp->GetBytes();
        size_t slotCount = blockp->nbytes / sizeof(void*);
        scanRootBytes += blockp->nbytes;
        for (size_t i=0; i< slotCount; i++)
        {
            VerifyMark(base[i]);
        }
        blockp = blockp->next;
    }
}